

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

bool __thiscall kws::Parser::IsInComments(Parser *this,size_t pos)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (((pos != 0xffffffffffffffff) && ((this->m_CommentBegin)._M_string_length != 0)) &&
     ((this->m_CommentEnd)._M_string_length != 0)) {
    psVar1 = &this->m_Buffer;
    uVar2 = std::__cxx11::string::find
                      ((char *)psVar1,(ulong)(this->m_CommentBegin)._M_dataplus._M_p,0);
    if (uVar2 == 0xffffffffffffffff) {
      return false;
    }
    uVar3 = std::__cxx11::string::find
                      ((char *)psVar1,(ulong)(this->m_CommentEnd)._M_dataplus._M_p,uVar2);
    if (uVar2 < uVar3 && uVar3 != 0xffffffffffffffff) {
      do {
        if ((uVar2 <= pos) && (pos <= uVar3 + (this->m_CommentEnd)._M_string_length)) {
          return true;
        }
        uVar2 = std::__cxx11::string::find
                          ((char *)psVar1,(ulong)(this->m_CommentBegin)._M_dataplus._M_p,uVar2 + 1);
        uVar3 = std::__cxx11::string::find
                          ((char *)psVar1,(ulong)(this->m_CommentEnd)._M_dataplus._M_p,uVar2);
        if (uVar3 <= uVar2) {
          return false;
        }
      } while (uVar3 != 0xffffffffffffffff);
      return false;
    }
  }
  return false;
}

Assistant:

bool Parser::IsInComments(size_t pos) const
{
  if ((pos == std::string::npos) || (m_CommentBegin.empty()) ||
      (m_CommentEnd.empty())) {
    return false;
  }

  size_t b0 = m_Buffer.find(m_CommentBegin,0);

  if(b0 == std::string::npos)
   {
   return false;
   }

  size_t b1 = m_Buffer.find(m_CommentEnd,b0);

  while(b0 != std::string::npos && b1 != std::string::npos && b1>b0)
    {
    if(pos>=b0 && pos<=(b1+m_CommentEnd.size()))
      {
      return true;
      }
    b0 = m_Buffer.find(m_CommentBegin,b0+1);
    b1 = m_Buffer.find(m_CommentEnd,b0);
    }

  return false;
}